

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildCommand.cxx
# Opt level: O2

bool __thiscall
cmBuildCommand::MainSignature
          (cmBuildCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  cmCommand *pcVar2;
  bool bVar3;
  pointer pbVar4;
  ulong uVar5;
  char *pcVar6;
  cmGlobalGenerator *this_00;
  ostream *poVar7;
  ulong uVar8;
  bool bVar9;
  pointer pbVar10;
  int iVar11;
  allocator local_22a;
  allocator local_229;
  string local_228;
  cmCommand *local_208;
  char *local_200;
  char *local_1f8;
  pointer local_1f0;
  string target;
  string local_1c8;
  string makecommand;
  
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 == pbVar10) {
    std::__cxx11::string::string
              ((string *)&makecommand,"requires at least one argument naming a CMake variable",
               (allocator *)&target);
    cmCommand::SetError(&this->super_cmCommand,&makecommand);
    std::__cxx11::string::~string((string *)&makecommand);
    bVar9 = false;
  }
  else {
    local_1f0 = (pbVar10->_M_dataplus)._M_p;
    target._M_dataplus._M_p = (pointer)&target.field_2;
    target._M_string_length = 0;
    target.field_2._M_local_buf[0] = '\0';
    local_1f8 = (char *)0x0;
    local_200 = (char *)0x0;
    iVar11 = 0;
    uVar8 = 1;
    local_208 = &this->super_cmCommand;
    for (; uVar5 = (long)pbVar4 - (long)pbVar10 >> 5, bVar9 = uVar5 <= uVar8, uVar8 < uVar5;
        uVar8 = (ulong)((int)uVar8 + 1)) {
      bVar3 = std::operator==(pbVar10 + uVar8,"CONFIGURATION");
      if (bVar3) {
        iVar11 = 1;
      }
      else {
        bVar3 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar8,"PROJECT_NAME");
        if (bVar3) {
          iVar11 = 2;
        }
        else {
          bVar3 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar8,"TARGET");
          if (bVar3) {
            iVar11 = 3;
          }
          else if (iVar11 == 3) {
            iVar11 = 0;
            std::__cxx11::string::_M_assign((string *)&target);
          }
          else {
            if (iVar11 == 2) {
              local_200 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p;
            }
            else {
              if (iVar11 != 1) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&makecommand);
                poVar7 = std::operator<<((ostream *)&makecommand,"unknown argument \"");
                pcVar2 = local_208;
                poVar7 = std::operator<<(poVar7,(string *)
                                                ((args->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + uVar8)
                                        );
                std::operator<<(poVar7,"\"");
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(pcVar2,&local_228);
                std::__cxx11::string::~string((string *)&local_228);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&makecommand);
                goto LAB_002a6906;
              }
              local_1f8 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p;
            }
            iVar11 = 0;
          }
        }
      }
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    if (((local_1f8 == (char *)0x0) || (pcVar6 = local_1f8, *local_1f8 == '\0')) &&
       ((pcVar6 = getenv("CMAKE_CONFIG_TYPE"), pcVar6 == (char *)0x0 || (*pcVar6 == '\0')))) {
      pcVar6 = "Release";
    }
    pcVar2 = local_208;
    if ((local_200 != (char *)0x0) && (*local_200 != '\0')) {
      pcVar1 = local_208->Makefile;
      std::__cxx11::string::string
                ((string *)&makecommand,"Ignoring PROJECT_NAME option because it has no effect.",
                 (allocator *)&local_228);
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&makecommand,false);
      std::__cxx11::string::~string((string *)&makecommand);
    }
    this_00 = cmMakefile::GetGlobalGenerator(pcVar2->Makefile);
    std::__cxx11::string::string((string *)&local_228,pcVar6,&local_229);
    std::__cxx11::string::string((string *)&local_1c8,"",&local_22a);
    bVar3 = cmMakefile::IgnoreErrorsCMP0061(pcVar2->Makefile);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              (&makecommand,this_00,&target,&local_228,&local_1c8,bVar3);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_228);
    pcVar1 = pcVar2->Makefile;
    std::__cxx11::string::string((string *)&local_228,local_1f0,(allocator *)&local_1c8);
    cmMakefile::AddDefinition(pcVar1,&local_228,makecommand._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&makecommand);
LAB_002a6906:
    std::__cxx11::string::~string((string *)&target);
  }
  return bVar9;
}

Assistant:

bool cmBuildCommand
::MainSignature(std::vector<std::string> const& args)
{
  if(args.size() < 1)
    {
    this->SetError("requires at least one argument naming a CMake variable");
    return false;
    }

  // The cmake variable in which to store the result.
  const char* variable = args[0].c_str();

  // Parse remaining arguments.
  const char* configuration = 0;
  const char* project_name = 0;
  std::string target;
  enum Doing { DoingNone, DoingConfiguration, DoingProjectName, DoingTarget };
  Doing doing = DoingNone;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "CONFIGURATION")
      {
      doing = DoingConfiguration;
      }
    else if(args[i] == "PROJECT_NAME")
      {
      doing = DoingProjectName;
      }
    else if(args[i] == "TARGET")
      {
      doing = DoingTarget;
      }
    else if(doing == DoingConfiguration)
      {
      doing = DoingNone;
      configuration = args[i].c_str();
      }
    else if(doing == DoingProjectName)
      {
      doing = DoingNone;
      project_name = args[i].c_str();
      }
    else if(doing == DoingTarget)
      {
      doing = DoingNone;
      target = args[i];
      }
    else
      {
      std::ostringstream e;
      e << "unknown argument \"" << args[i] << "\"";
      this->SetError(e.str());
      return false;
      }
    }

  // If null/empty CONFIGURATION argument, cmake --build uses 'Debug'
  // in the currently implemented multi-configuration global generators...
  // so we put this code here to end up with the same default configuration
  // as the original 2-arg build_command signature:
  //
  if(!configuration || !*configuration)
    {
    configuration = getenv("CMAKE_CONFIG_TYPE");
    }
  if(!configuration || !*configuration)
    {
    configuration = "Release";
    }

  if(project_name && *project_name)
    {
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,
      "Ignoring PROJECT_NAME option because it has no effect.");
    }

  std::string makecommand = this->Makefile->GetGlobalGenerator()
    ->GenerateCMakeBuildCommand(target, configuration, "",
                                this->Makefile->IgnoreErrorsCMP0061());

  this->Makefile->AddDefinition(variable, makecommand.c_str());

  return true;
}